

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

size_t __thiscall Imf_3_3::IDManifest::find(IDManifest *this,string *channel)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  vector<Imf_3_3::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_3::IDManifest::ChannelGroupManifest>_>
  *in_RDI;
  size_t i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  _Self local_30;
  _Self local_28;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    sVar3 = std::
            vector<Imf_3_3::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_3::IDManifest::ChannelGroupManifest>_>
            ::size(in_RDI);
    if (sVar3 <= uVar1) {
      sVar3 = std::
              vector<Imf_3_3::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_3::IDManifest::ChannelGroupManifest>_>
              ::size(in_RDI);
      return sVar3;
    }
    pvVar4 = std::
             vector<Imf_3_3::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_3::IDManifest::ChannelGroupManifest>_>
             ::operator[](in_RDI,local_20);
    ChannelGroupManifest::getChannels_abi_cxx11_(pvVar4);
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(in_stack_ffffffffffffffb8,(key_type *)0x1f347a);
    pvVar4 = std::
             vector<Imf_3_3::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_3::IDManifest::ChannelGroupManifest>_>
             ::operator[](in_RDI,local_20);
    ChannelGroupManifest::getChannels_abi_cxx11_(pvVar4);
    local_30._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(in_stack_ffffffffffffffb8);
    bVar2 = std::operator!=(&local_28,&local_30);
    if (bVar2) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

size_t
IDManifest::find (const string& channel) const
{
    // search the set of channels for each ChannelGroupManifest searching for
    // one that contains 'channel'
    for (size_t i = 0; i < _manifest.size (); ++i)
    {

        if (_manifest[i].getChannels ().find (channel) !=
            _manifest[i].getChannels ().end ())
        {
            return i;
        }
    }
    //  not find, return size()
    return _manifest.size ();
}